

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

int __thiscall Kvm::repl(Kvm *this,istream *in,ostream *out)

{
  Value *pVVar1;
  ostream *this_00;
  size_t in_RCX;
  void *__buf;
  KatException *e;
  Value *r;
  Value *v;
  ostream *out_local;
  istream *in_local;
  Kvm *this_local;
  
  do {
    std::operator<<(out,"kat> ");
    pVVar1 = (Value *)read(this,(int)in,__buf,in_RCX);
    if (pVVar1 == (Value *)0x0) {
      printf("Fatal error -- READ!\n");
LAB_0011e6dc:
      this_00 = std::operator<<(out,"Goodbye");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    pVVar1 = eval(this,pVVar1,this->GLOBAL_ENV);
    if (pVVar1 == (Value *)0x0) {
      printf("Fatal error -- EVAL!\n");
      goto LAB_0011e6dc;
    }
    print(this,pVVar1,out);
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  } while( true );
}

Assistant:

int Kvm::repl(std::istream &in, std::ostream &out)
{
    while (true)
    {
        try
        {
            out << "kat> ";
            auto v = read(in);
            if (!v)
            {
                printf("Fatal error -- READ!\n");
                break;
            }
            auto r = eval(v, GLOBAL_ENV);
            if (!r)
            {
                printf("Fatal error -- EVAL!\n");
                break;
            }
            print(r, out);
            out << endl;
        } catch (KatException &e)
        {
            out << e.what() << endl;
            in.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
        }
    }
    out << "Goodbye" << endl;
    return 0;
}